

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.hpp
# Opt level: O0

void __thiscall
baryonyx::details::ap_file_observer::make_observation<float>
          (ap_file_observer *this,sparse_matrix<int> *ap,float *P,float *param_3)

{
  string *__return_storage_ptr__;
  value_type vVar1;
  reference pvVar2;
  remove_reference_t<int> *in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  format_args args;
  undefined1 local_358 [16];
  ostream_iterator<float,_char,_std::char_traits<char>_> local_348;
  ostream_iterator<float,_char,_std::char_traits<char>_> *local_338;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_330;
  __tuple_element_t<1UL,_tuple<const_row_value_*,_const_row_value_*>_> *local_328;
  type *et;
  type *it;
  unique_ptr<int[],_std::default_delete<int[]>_> local_308;
  float local_2fc;
  unique_ptr<baryonyx::sparse_matrix<int>::row_value[],_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
  local_2f8;
  size_type local_2f0;
  int k;
  undefined1 local_2dc [4];
  string local_2d8;
  ostream_type local_2b8 [8];
  ofstream ofs;
  float *param_3_local;
  float *P_local;
  sparse_matrix<int> *ap_local;
  ap_file_observer *this_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_90;
  basic_string_view<char> local_88;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_78;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *local_58;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *vargs;
  string *local_48;
  char *local_40;
  string *local_38;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *local_10;
  
  local_48 = &this->m_basename;
  local_2dc = (undefined1  [4])this->m_frame;
  this->m_frame = (int)local_2dc + 1;
  __return_storage_ptr__ = (string *)(local_2dc + 4);
  local_40 = "{}-P-{}.txt";
  vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
           *)local_2dc;
  local_38 = __return_storage_ptr__;
  ::fmt::v7::make_args_checked<std::__cxx11::string&,int,char[12],char>
            (&local_78,(v7 *)"{}-P-{}.txt",(char (*) [12])local_48,
             (remove_reference_t<std::__cxx11::basic_string<char>_&> *)vargs,in_R8);
  local_58 = &local_78;
  local_88 = ::fmt::v7::to_string_view<char,_0>(local_40);
  local_28 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              *)&this_local;
  local_30 = local_58;
  local_20 = local_58;
  local_10 = local_58;
  local_18 = local_28;
  ::fmt::v7::
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  basic_format_args(local_28,0x1d,
                    (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)local_58);
  format_str.size_ = (size_t)this_local;
  format_str.data_ = (char *)local_88.size_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ = in_R9.values_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)local_90.values_;
  ::fmt::v7::detail::vformat_abi_cxx11_
            (__return_storage_ptr__,(detail *)local_88.data_,format_str,args);
  std::ofstream::ofstream(local_2b8,(string *)__return_storage_ptr__,_S_out);
  std::__cxx11::string::~string((string *)(local_2dc + 4));
  for (local_2f0 = 0; local_2f0 != this->constraints; local_2f0 = local_2f0 + 1) {
    local_2f8._M_t.
    super___uniq_ptr_impl<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
    ._M_t.
    super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
    .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl =
         (__uniq_ptr_data<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>,_true,_true>
          )std::begin<std::vector<float,std::allocator<float>>>(&this->m_value);
    local_2fc = 0.0;
    local_308._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
    super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
    _M_head_impl = (__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)
                   std::
                   fill_n<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,int,float>
                             ((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>
                               )local_2f8._M_t.
                                super___uniq_ptr_impl<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                                .
                                super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>
                                ._M_head_impl,this->variables,&local_2fc);
    sparse_matrix<int>::row((sparse_matrix<int> *)&it,(int)ap);
    et = std::
         get<0ul,baryonyx::sparse_matrix<int>::row_value_const*,baryonyx::sparse_matrix<int>::row_value_const*>
                   ((tuple<const_baryonyx::sparse_matrix<int>::row_value_*,_const_baryonyx::sparse_matrix<int>::row_value_*>
                     *)&it);
    local_328 = std::
                get<1ul,baryonyx::sparse_matrix<int>::row_value_const*,baryonyx::sparse_matrix<int>::row_value_const*>
                          ((tuple<const_baryonyx::sparse_matrix<int>::row_value_*,_const_baryonyx::sparse_matrix<int>::row_value_*>
                            *)&it);
    while (*et != *local_328) {
      vVar1 = P[(*et)->value];
      pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                         (&this->m_value,(long)(*et)->column);
      *pvVar2 = vVar1;
      *et = *et + 1;
    }
    local_330._M_current =
         (float *)std::vector<float,_std::allocator<float>_>::begin(&this->m_value);
    local_338 = (ostream_iterator<float,_char,_std::char_traits<char>_> *)
                std::vector<float,_std::allocator<float>_>::end(&this->m_value);
    std::ostream_iterator<float,_char,_std::char_traits<char>_>::ostream_iterator
              (&local_348,local_2b8," ");
    std::
    copy<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,std::ostream_iterator<float,char,std::char_traits<char>>>
              ((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)local_358,
               local_330,local_338);
    std::operator<<(local_2b8,'\n');
  }
  std::ofstream::~ofstream(local_2b8);
  return;
}

Assistant:

void make_observation(const sparse_matrix<int>& ap,
                          const Float* P,
                          const Float* /*pi*/)
    {
        static_assert(std::is_floating_point<Float>::value);

        std::ofstream ofs(fmt::format("{}-P-{}.txt", m_basename, m_frame++));

        for (int k = 0; k != constraints; ++k) {
            std::fill_n(std::begin(m_value), variables, 0.0f);

            auto [it, et] = ap.row(k);
            for (; it != et; ++it)
                m_value[it->column] = static_cast<float>(P[it->value]);

            std::copy(m_value.begin(),
                      m_value.end(),
                      std::ostream_iterator<Float>(ofs, " "));

            ofs << '\n';
        }
    }